

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::copyTexImage1D
          (ReferenceContext *this,deUint32 target,int level,deUint32 internalFormat,int x,int y,
          int width,int border)

{
  uint uVar1;
  Texture1D *pTVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int y_00;
  pointer pTVar7;
  Texture1D *pTVar8;
  int x_00;
  PixelBufferAccess dst;
  MultisampleConstPixelBufferAccess src;
  TextureFormat local_a0;
  int local_98;
  int local_94;
  MultisamplePixelBufferAccess local_90;
  MultisampleConstPixelBufferAccess local_68;
  
  pTVar7 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_activeTexture;
  local_a0.order = CHANNELORDER_LAST;
  local_a0.type = CHANNELTYPE_LAST;
  local_98 = x;
  local_94 = y;
  getReadColorbuffer(&local_90,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_68,&local_90);
  if ((border == 0) && (-1 < (width | level))) {
    if ((local_68.m_access.m_size.m_data[0] == 0) ||
       ((local_68.m_access.m_size.m_data[1] == 0 || (local_68.m_access.m_size.m_data[2] == 0)))) {
LAB_004e2f37:
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x502;
      return;
    }
    local_a0 = mapInternalFormat(internalFormat);
    if ((local_a0.type == CHANNELTYPE_LAST || local_a0.order == CHANNELORDER_LAST) ||
       (target != 0xde0)) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x500;
      return;
    }
    uVar1 = (this->m_limits).maxTexture2DSize;
    if (width <= (int)uVar1) {
      if (uVar1 == 0) {
        uVar6 = 0x20;
      }
      else {
        uVar6 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar6 = uVar6 ^ 0x1f;
      }
      if (level <= (int)(0x1f - uVar6)) {
        pTVar2 = pTVar7->tex1DBinding;
        pTVar8 = &pTVar7->default1DTex;
        if (pTVar2 != (Texture1D *)0x0) {
          pTVar8 = pTVar2;
        }
        if ((pTVar8->super_Texture).m_immutable == true) {
          if ((((0xd < (uint)level) ||
               (*(long *)((long)((pTVar8->m_levels).m_data + (uint)level) + 8) == 0)) ||
              (uVar3 = *(undefined8 *)((pTVar8->m_levels).m_access + (uint)level),
              local_a0.order != (ChannelOrder)uVar3)) ||
             ((local_a0.type != (ChannelType)((ulong)uVar3 >> 0x20) ||
              (*(int *)((long)((pTVar8->m_levels).m_access + (uint)level) + 8) != width))))
          goto LAB_004e2f37;
        }
        else {
          rc::TextureLevelArray::allocLevel(&pTVar8->m_levels,level,&local_a0,width,1,1);
        }
        iVar4 = local_98;
        local_90.m_access.super_ConstPixelBufferAccess.m_format =
             *(TextureFormat *)((pTVar8->m_levels).m_access + level);
        lVar5 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_size.m_data[lVar5] =
               *(int *)((long)((pTVar8->m_levels).m_access + level) + 8U + lVar5 * 4);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        lVar5 = 0;
        do {
          local_90.m_access.super_ConstPixelBufferAccess.m_pitch.m_data[lVar5] =
               *(int *)((long)((pTVar8->m_levels).m_access + level) + 0x14U + lVar5 * 4);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        local_90.m_access.super_ConstPixelBufferAccess.m_data =
             *(void **)((long)((pTVar8->m_levels).m_access + level) + 0x20);
        if (width < 1) {
          return;
        }
        x_00 = 0;
        do {
          y_00 = iVar4 + x_00;
          if ((-1 < y_00) && (y_00 < local_68.m_access.m_size.m_data[1])) {
            rr::resolveMultisamplePixel
                      ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)&local_68,
                       y_00);
            tcu::PixelBufferAccess::setPixel
                      (&local_90.m_access,(Vec4 *)&stack0xffffffffffffffc0,x_00,0,0);
          }
          x_00 = x_00 + 1;
        } while (width != x_00);
        return;
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::copyTexImage1D (deUint32 target, int level, deUint32 internalFormat, int x, int y, int width, int border)
{
	TextureUnit&							unit		= m_textureUnits[m_activeTexture];
	TextureFormat							storageFmt;
	rr::MultisampleConstPixelBufferAccess	src			= getReadColorbuffer();

	RC_IF_ERROR(border != 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || level < 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(isEmpty(src), GL_INVALID_OPERATION, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_1D)
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture1D* texture = unit.tex1DBinding ? unit.tex1DBinding : &unit.default1DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width);

		// Copy from current framebuffer.
		PixelBufferAccess dst = texture->getLevel(level);
		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()))
				continue; // Undefined pixel.

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y), xo, 0);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}